

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::GenerateRegressionImages(cmCTestTestHandler *this,cmXMLWriter *xml,string *dart)

{
  pointer pcVar1;
  char *pcVar2;
  cmCTest *this_00;
  char cVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  cmCTestTestHandler *pcVar6;
  bool bVar7;
  int iVar8;
  unsigned_long length;
  uchar *puVar9;
  size_t sVar10;
  ostream *poVar11;
  long *plVar12;
  ulong *puVar13;
  size_type *psVar14;
  ulong uVar15;
  char *pcVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string k2;
  string v2;
  ifstream ifs;
  string cxml;
  ostringstream ostr;
  RegularExpression measurementfile;
  RegularExpression fourattributes;
  RegularExpression twoattributes;
  RegularExpression threeattributes;
  RegularExpression cdatastart;
  RegularExpression cdataend;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  string local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  undefined1 local_920 [112];
  ios_base local_8b0 [408];
  long *local_718 [2];
  long local_708 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8 [3];
  ios_base local_688 [264];
  string local_580;
  uchar *local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  cmCTestTestHandler *local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  RegularExpression local_510;
  RegularExpression local_440;
  RegularExpression local_370;
  RegularExpression local_2a0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_370.regmatch.startp[0] = (char *)0x0;
  local_370.regmatch.endp[0] = (char *)0x0;
  local_370.regmatch.searchstring = (char *)0x0;
  local_370.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_370,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_2a0.regmatch.startp[0] = (char *)0x0;
  local_2a0.regmatch.endp[0] = (char *)0x0;
  local_2a0.regmatch.searchstring = (char *)0x0;
  local_2a0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_2a0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_440.regmatch.startp[0] = (char *)0x0;
  local_440.regmatch.endp[0] = (char *)0x0;
  local_440.regmatch.searchstring = (char *)0x0;
  local_440.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_440,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_1d0.regmatch.startp[0] = (char *)0x0;
  local_1d0.regmatch.endp[0] = (char *)0x0;
  local_1d0.regmatch.searchstring = (char *)0x0;
  local_1d0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_1d0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>[ \t\r\n]*<!\\[CDATA\\["
            );
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"]]>[ \t\r\n]*</DartMeasurement>");
  local_510.regmatch.startp[0] = (char *)0x0;
  local_510.regmatch.endp[0] = (char *)0x0;
  local_510.regmatch.searchstring = (char *)0x0;
  local_510.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_510,
             "<DartMeasurementFile[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurementFile>"
            );
  local_718[0] = local_708;
  pcVar1 = (dart->_M_dataplus)._M_p;
  local_538 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_718,pcVar1,pcVar1 + dart->_M_string_length);
  do {
    while( true ) {
      paVar17 = &local_6f8[0].field_2;
      pcVar16 = local_920 + 0x10;
      bVar7 = cmsys::RegularExpression::find(&local_370,(char *)local_718[0],&local_370.regmatch);
      if (!bVar7) break;
      local_920._0_8_ = local_920 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_920);
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_370.regmatch.startp[1] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_370.regmatch.startp[1],local_370.regmatch.endp[1]);
      }
      uVar4 = local_920._0_8_;
      if (local_370.regmatch.startp[2] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_370.regmatch.startp[2],local_370.regmatch.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_370.regmatch.startp[3] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_370.regmatch.startp[3],local_370.regmatch.endp[3]);
      }
      uVar4 = local_920._0_8_;
      if (local_370.regmatch.startp[4] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_370.regmatch.startp[4],local_370.regmatch.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      local_920._0_8_ = local_920 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"Value","");
      if (local_370.regmatch.startp[5] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_370.regmatch.startp[5],local_370.regmatch.endp[5]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_920);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_6f8);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar15 = (long)local_370.regmatch.startp[0] - (long)local_370.regmatch.searchstring;
LAB_001b34f7:
      std::__cxx11::string::erase((ulong)local_718,uVar15);
    }
    bVar7 = cmsys::RegularExpression::find(&local_2a0,(char *)local_718[0],&local_2a0.regmatch);
    if (bVar7) {
      local_920._0_8_ = local_920 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_920);
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_2a0.regmatch.startp[1] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_2a0.regmatch.startp[1],local_2a0.regmatch.endp[1]);
      }
      uVar4 = local_920._0_8_;
      if (local_2a0.regmatch.startp[2] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_2a0.regmatch.startp[2],local_2a0.regmatch.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_2a0.regmatch.startp[3] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_2a0.regmatch.startp[3],local_2a0.regmatch.endp[3]);
      }
      uVar4 = local_920._0_8_;
      if (local_2a0.regmatch.startp[4] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_2a0.regmatch.startp[4],local_2a0.regmatch.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_2a0.regmatch.startp[5] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_2a0.regmatch.startp[5],local_2a0.regmatch.endp[5]);
      }
      uVar4 = local_920._0_8_;
      if (local_2a0.regmatch.startp[6] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_2a0.regmatch.startp[6],local_2a0.regmatch.endp[6]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      local_920._0_8_ = local_920 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"Value","");
      if (local_370.regmatch.startp[7] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_370.regmatch.startp[7],local_370.regmatch.endp[7]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_920);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_6f8);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar15 = (long)local_2a0.regmatch.startp[0] - (long)local_2a0.regmatch.searchstring;
      goto LAB_001b34f7;
    }
    bVar7 = cmsys::RegularExpression::find(&local_440,(char *)local_718[0],&local_440.regmatch);
    if (bVar7) {
      local_920._0_8_ = local_920 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_920);
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_440.regmatch.startp[1] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.regmatch.startp[1],local_440.regmatch.endp[1]);
      }
      uVar4 = local_920._0_8_;
      if (local_440.regmatch.startp[2] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_440.regmatch.startp[2],local_440.regmatch.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_440.regmatch.startp[3] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.regmatch.startp[3],local_440.regmatch.endp[3]);
      }
      uVar4 = local_920._0_8_;
      if (local_440.regmatch.startp[4] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_440.regmatch.startp[4],local_440.regmatch.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_440.regmatch.startp[5] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.regmatch.startp[5],local_440.regmatch.endp[5]);
      }
      uVar4 = local_920._0_8_;
      if (local_440.regmatch.startp[6] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_440.regmatch.startp[6],local_440.regmatch.endp[6]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      if (local_440.regmatch.startp[7] == (char *)0x0) {
        local_920._0_8_ = local_920 + 0x10;
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
      }
      else {
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_440.regmatch.startp[7],local_440.regmatch.endp[7]);
      }
      uVar4 = local_920._0_8_;
      if (local_440.regmatch.startp[8] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_440.regmatch.startp[8],local_440.regmatch.endp[8]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      local_920._0_8_ = local_920 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"Value","");
      if (local_370.regmatch.startp[9] == (char *)0x0) {
        local_6f8[0]._M_string_length = 0;
        local_6f8[0].field_2._M_allocated_capacity =
             local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6f8,local_370.regmatch.startp[9],local_370.regmatch.endp[9]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_920);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_6f8);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != paVar17) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar15 = (long)local_440.regmatch.startp[0] - (long)local_440.regmatch.searchstring;
      goto LAB_001b34f7;
    }
    bVar7 = cmsys::RegularExpression::find(&local_1d0,(char *)local_718[0],&local_1d0.regmatch);
    if (bVar7) {
      bVar7 = cmsys::RegularExpression::find(&local_100,(char *)local_718[0],&local_100.regmatch);
      if (bVar7) {
        local_920._0_8_ = pcVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_920);
        if ((char *)local_920._0_8_ != pcVar16) {
          operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
        }
        if (local_1d0.regmatch.startp[1] == (char *)0x0) {
          local_920._8_8_ = 0;
          local_920[0x10] = '\0';
          local_920._0_8_ = pcVar16;
        }
        else {
          local_920._0_8_ = pcVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_1d0.regmatch.startp[1],local_1d0.regmatch.endp[1]);
        }
        uVar4 = local_920._0_8_;
        if (local_1d0.regmatch.startp[2] == (char *)0x0) {
          local_6f8[0]._M_string_length = 0;
          local_6f8[0].field_2._M_allocated_capacity =
               local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6f8,local_1d0.regmatch.startp[2],local_1d0.regmatch.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8[0]._M_dataplus._M_p != paVar17) {
          operator_delete(local_6f8[0]._M_dataplus._M_p,
                          local_6f8[0].field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_920._0_8_ != pcVar16) {
          operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
        }
        if (local_1d0.regmatch.startp[3] == (char *)0x0) {
          local_920._0_8_ = local_920 + 0x10;
          local_920._8_8_ = 0;
          local_920[0x10] = '\0';
        }
        else {
          local_920._0_8_ = local_920 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_1d0.regmatch.startp[3],local_1d0.regmatch.endp[3]);
        }
        uVar4 = local_920._0_8_;
        if (local_1d0.regmatch.startp[4] == (char *)0x0) {
          local_6f8[0]._M_string_length = 0;
          local_6f8[0].field_2._M_allocated_capacity =
               local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6f8,local_1d0.regmatch.startp[4],local_1d0.regmatch.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)uVar4,local_6f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8[0]._M_dataplus._M_p != paVar17) {
          operator_delete(local_6f8[0]._M_dataplus._M_p,
                          local_6f8[0].field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
          operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
        }
        local_920._0_8_ = local_920 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"Value","");
        cmXMLWriter::StartElement(xml,(string *)local_920);
        if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
          operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
        }
        std::__cxx11::string::substr((ulong)local_920,(ulong)local_718);
        cmXMLWriter::CData(xml,(string *)local_920);
        if ((undefined1 *)local_920._0_8_ != local_920 + 0x10) {
          operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        cmXMLWriter::EndElement(xml);
        uVar15 = (long)local_1d0.regmatch.startp[0] - (long)local_1d0.regmatch.searchstring;
        goto LAB_001b34f7;
      }
    }
    bVar7 = cmsys::RegularExpression::find(&local_510,(char *)local_718[0],&local_510.regmatch);
    if (!bVar7) {
      if (local_718[0] != local_708) {
        operator_delete(local_718[0],local_708[0] + 1);
      }
      if (local_510.program != (char *)0x0) {
        operator_delete__(local_510.program);
      }
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
      if (local_1d0.program != (char *)0x0) {
        operator_delete__(local_1d0.program);
      }
      if (local_440.program != (char *)0x0) {
        operator_delete__(local_440.program);
      }
      if (local_2a0.program != (char *)0x0) {
        operator_delete__(local_2a0.program);
      }
      if (local_370.program != (char *)0x0) {
        operator_delete__(local_370.program);
      }
      return;
    }
    if (local_510.regmatch.startp[5] == (char *)0x0) {
      local_920._8_8_ = 0;
      local_920[0x10] = '\0';
      local_920._0_8_ = pcVar16;
    }
    else {
      local_920._0_8_ = pcVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_920,local_510.regmatch.startp[5],local_510.regmatch.endp[5]);
    }
    cmCTest::CleanString(&local_580,(string *)local_920);
    if ((char *)local_920._0_8_ != pcVar16) {
      operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
    }
    bVar7 = cmsys::SystemTools::FileExists(&local_580);
    if (bVar7) {
      length = cmsys::SystemTools::FileLength(&local_580);
      if (length == 0) {
        if (local_510.regmatch.startp[1] == (char *)0x0) {
          local_920._8_8_ = 0;
          local_920[0x10] = '\0';
          local_920._0_8_ = pcVar16;
        }
        else {
          local_920._0_8_ = pcVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_920,local_510.regmatch.startp[1],local_510.regmatch.endp[1]);
        }
        if (local_510.regmatch.startp[2] == (char *)0x0) {
          local_6f8[0]._M_string_length = 0;
          local_6f8[0].field_2._M_allocated_capacity =
               local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_6f8[0]._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6f8,local_510.regmatch.startp[2],local_510.regmatch.endp[2]);
        }
        if (local_510.regmatch.startp[3] == (char *)0x0) {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          local_980._M_string_length = 0;
          local_980.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_980,local_510.regmatch.startp[3],local_510.regmatch.endp[3]);
        }
        if (local_510.regmatch.startp[4] == (char *)0x0) {
          local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
          local_940._M_string_length = 0;
          local_940.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_940,local_510.regmatch.startp[4],local_510.regmatch.endp[4]);
        }
        cmsys::SystemTools::LowerCase(&local_960,(string *)local_920);
        iVar8 = std::__cxx11::string::compare((char *)&local_960);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        if (iVar8 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)local_6f8,0,(char *)local_6f8[0]._M_string_length,0x5333b3);
        }
        cmsys::SystemTools::LowerCase(&local_960,&local_980);
        iVar8 = std::__cxx11::string::compare((char *)&local_960);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        if (iVar8 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_940,0,(char *)local_940._M_string_length,0x5333b3);
        }
        local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,&local_960);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)local_920._0_8_,local_6f8);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,local_980._M_dataplus._M_p,&local_940);
        cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x53516a);
        local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"Value","");
        std::operator+(&local_530,"Image ",&local_580);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_530);
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_558.field_2._M_allocated_capacity = *psVar14;
          local_558.field_2._8_8_ = plVar12[3];
        }
        else {
          local_558.field_2._M_allocated_capacity = *psVar14;
          local_558._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_558._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        cmXMLWriter::StartElement(xml,&local_960);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&local_558);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != &local_530.field_2) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != &local_960.field_2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_940._M_dataplus._M_p != &local_940.field_2) {
          operator_delete(local_940._M_dataplus._M_p,
                          CONCAT71(local_940.field_2._M_allocated_capacity._1_7_,
                                   local_940.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8[0]._M_dataplus._M_p != paVar17) {
          operator_delete(local_6f8[0]._M_dataplus._M_p,
                          local_6f8[0].field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_920._0_8_ != pcVar16) {
          operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
        }
      }
      else {
        std::ifstream::ifstream(local_920,local_580._M_dataplus._M_p,_S_in);
        puVar9 = (uchar *)operator_new__(length + 1);
        std::istream::read(local_920,(long)puVar9);
        local_560 = puVar9;
        puVar9 = (uchar *)operator_new__((long)(int)((double)(long)length * 1.5 + 5.0));
        sVar10 = cmsysBase64_Encode(local_560,length,puVar9,1);
        local_6f8[0]._M_dataplus._M_p = (pointer)&local_6f8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,local_6f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8[0]._M_dataplus._M_p != &local_6f8[0].field_2) {
          operator_delete(local_6f8[0]._M_dataplus._M_p,
                          local_6f8[0].field_2._M_allocated_capacity + 1);
        }
        if (local_510.regmatch.startp[1] == (char *)0x0) {
          local_6f8[0]._M_dataplus._M_p = (pointer)&local_6f8[0].field_2;
          local_6f8[0]._M_string_length = 0;
          local_6f8[0].field_2._M_allocated_capacity =
               local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_6f8[0]._M_dataplus._M_p = (pointer)&local_6f8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6f8,local_510.regmatch.startp[1],local_510.regmatch.endp[1]);
        }
        _Var5._M_p = local_6f8[0]._M_dataplus._M_p;
        if (local_510.regmatch.startp[2] == (char *)0x0) {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          local_980._M_string_length = 0;
          local_980.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_980,local_510.regmatch.startp[2],local_510.regmatch.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var5._M_p,&local_980);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8[0]._M_dataplus._M_p != &local_6f8[0].field_2) {
          operator_delete(local_6f8[0]._M_dataplus._M_p,
                          local_6f8[0].field_2._M_allocated_capacity + 1);
        }
        if (local_510.regmatch.startp[3] == (char *)0x0) {
          local_6f8[0]._M_dataplus._M_p = (pointer)&local_6f8[0].field_2;
          local_6f8[0]._M_string_length = 0;
          local_6f8[0].field_2._M_allocated_capacity =
               local_6f8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_6f8[0]._M_dataplus._M_p = (pointer)&local_6f8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6f8,local_510.regmatch.startp[3],local_510.regmatch.endp[3]);
        }
        _Var5._M_p = local_6f8[0]._M_dataplus._M_p;
        if (local_510.regmatch.startp[4] == (char *)0x0) {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          local_980._M_string_length = 0;
          local_980.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_980,local_510.regmatch.startp[4],local_510.regmatch.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,_Var5._M_p,&local_980);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8[0]._M_dataplus._M_p != &local_6f8[0].field_2) {
          operator_delete(local_6f8[0]._M_dataplus._M_p,
                          local_6f8[0].field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
        if (sVar10 != 0) {
          uVar15 = 0;
          do {
            local_980._M_dataplus._M_p._0_1_ = puVar9[uVar15];
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6f8,(char *)&local_980,1);
            if ((uVar15 != 0) && ((uVar15 / 0x3c) * 0x3c - uVar15 == 0)) {
              cVar3 = (char)local_6f8;
              std::ios::widen((char)*(undefined8 *)(local_6f8[0]._M_dataplus._M_p + -0x18) + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
            }
            uVar15 = uVar15 + 1;
          } while (sVar10 != uVar15);
        }
        local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"Value","");
        std::__cxx11::stringbuf::str();
        cmXMLWriter::StartElement(xml,&local_980);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&local_940);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_940._M_dataplus._M_p != &local_940.field_2) {
          operator_delete(local_940._M_dataplus._M_p,
                          CONCAT71(local_940.field_2._M_allocated_capacity._1_7_,
                                   local_940.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_980._M_dataplus._M_p != &local_980.field_2) {
          operator_delete(local_980._M_dataplus._M_p,
                          CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                   local_980.field_2._M_local_buf[0]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        operator_delete__(local_560);
        operator_delete__(puVar9);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
        std::ios_base::~ios_base(local_688);
        std::ifstream::~ifstream(local_920);
      }
    }
    else {
      if (local_510.regmatch.startp[1] == (char *)0x0) {
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
        local_920._0_8_ = pcVar16;
      }
      else {
        local_920._0_8_ = pcVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,local_510.regmatch.startp[1],local_510.regmatch.endp[1]);
      }
      iVar8 = std::__cxx11::string::compare(local_920);
      if ((char *)local_920._0_8_ != pcVar16) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      local_920._0_8_ = pcVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_920);
      if ((char *)local_920._0_8_ != pcVar16) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      pcVar2 = local_510.regmatch.startp[(ulong)(iVar8 != 0) * 2 + 2];
      if (pcVar2 == (char *)0x0) {
        local_920._8_8_ = 0;
        local_920[0x10] = '\0';
        local_920._0_8_ = pcVar16;
      }
      else {
        local_920._0_8_ = pcVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_920,pcVar2,local_510.regmatch.endp[(ulong)(iVar8 != 0) * 2 + 2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,"name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_920);
      if ((char *)local_920._0_8_ != pcVar16) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
      local_920._0_8_ = pcVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_920,"Value","");
      std::operator+(&local_980,"File ",&local_580);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_980);
      local_6f8[0]._M_dataplus._M_p = (pointer)&local_6f8[0].field_2;
      puVar13 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_6f8[0].field_2._0_8_ = *puVar13;
        local_6f8[0].field_2._8_8_ = plVar12[3];
      }
      else {
        local_6f8[0].field_2._0_8_ = *puVar13;
        local_6f8[0]._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_6f8[0]._M_string_length = plVar12[1];
      *plVar12 = (long)puVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cmXMLWriter::StartElement(xml,(string *)local_920);
      cmXMLWriter::Content<std::__cxx11::string>(xml,local_6f8);
      cmXMLWriter::EndElement(xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != &local_6f8[0].field_2) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_980._M_dataplus._M_p != &local_980.field_2) {
        operator_delete(local_980._M_dataplus._M_p,
                        CONCAT71(local_980.field_2._M_allocated_capacity._1_7_,
                                 local_980.field_2._M_local_buf[0]) + 1);
      }
      if ((char *)local_920._0_8_ != pcVar16) {
        operator_delete((void *)local_920._0_8_,CONCAT71(local_920._17_7_,local_920[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_920);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_920,"File \"",6);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_920,local_580._M_dataplus._M_p,
                           local_580._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" not found.",0xc);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar6 = local_538;
      this_00 = (local_538->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x7fe,local_6f8[0]._M_dataplus._M_p,(pcVar6->super_cmCTestGenericHandler).Quiet)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8[0]._M_dataplus._M_p != &local_6f8[0].field_2) {
        operator_delete(local_6f8[0]._M_dataplus._M_p,local_6f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_920);
      std::ios_base::~ios_base(local_8b0);
    }
    std::__cxx11::string::erase
              ((ulong)local_718,
               (long)local_510.regmatch.startp[0] - (long)local_510.regmatch.searchstring);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

void cmCTestTestHandler::GenerateRegressionImages(cmXMLWriter& xml,
                                                  const std::string& dart)
{
  cmsys::RegularExpression twoattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression threeattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression fourattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression cdatastart(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>" SPACE_REGEX "*<!\\[CDATA\\[");
  cmsys::RegularExpression cdataend("]]>" SPACE_REGEX "*</DartMeasurement>");
  cmsys::RegularExpression measurementfile(
    "<DartMeasurementFile" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurementFile>");

  bool done = false;
  std::string cxml = dart;
  while (!done) {
    if (twoattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(twoattributes.match(1).c_str(), twoattributes.match(2));
      xml.Attribute(twoattributes.match(3).c_str(), twoattributes.match(4));
      xml.Element("Value", twoattributes.match(5));
      xml.EndElement();
      cxml.erase(twoattributes.start(),
                 twoattributes.end() - twoattributes.start());
    } else if (threeattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(threeattributes.match(1).c_str(),
                    threeattributes.match(2));
      xml.Attribute(threeattributes.match(3).c_str(),
                    threeattributes.match(4));
      xml.Attribute(threeattributes.match(5).c_str(),
                    threeattributes.match(6));
      xml.Element("Value", twoattributes.match(7));
      xml.EndElement();
      cxml.erase(threeattributes.start(),
                 threeattributes.end() - threeattributes.start());
    } else if (fourattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(fourattributes.match(1).c_str(), fourattributes.match(2));
      xml.Attribute(fourattributes.match(3).c_str(), fourattributes.match(4));
      xml.Attribute(fourattributes.match(5).c_str(), fourattributes.match(6));
      xml.Attribute(fourattributes.match(7).c_str(), fourattributes.match(8));
      xml.Element("Value", twoattributes.match(9));
      xml.EndElement();
      cxml.erase(fourattributes.start(),
                 fourattributes.end() - fourattributes.start());
    } else if (cdatastart.find(cxml) && cdataend.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(cdatastart.match(1).c_str(), cdatastart.match(2));
      xml.Attribute(cdatastart.match(3).c_str(), cdatastart.match(4));
      xml.StartElement("Value");
      xml.CData(
        cxml.substr(cdatastart.end(), cdataend.start() - cdatastart.end()));
      xml.EndElement(); // Value
      xml.EndElement(); // NamedMeasurement
      cxml.erase(cdatastart.start(), cdataend.end() - cdatastart.start());
    } else if (measurementfile.find(cxml)) {
      const std::string& filename =
        cmCTest::CleanString(measurementfile.match(5));
      if (cmSystemTools::FileExists(filename)) {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          std::string k1 = measurementfile.match(1);
          std::string v1 = measurementfile.match(2);
          std::string k2 = measurementfile.match(3);
          std::string v2 = measurementfile.match(4);
          if (cmSystemTools::LowerCase(k1) == "type") {
            v1 = "text/string";
          }
          if (cmSystemTools::LowerCase(k2) == "type") {
            v2 = "text/string";
          }

          xml.StartElement("NamedMeasurement");
          xml.Attribute(k1.c_str(), v1);
          xml.Attribute(k2.c_str(), v2);
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          cmsys::ifstream ifs(filename.c_str(),
                              std::ios::in
#ifdef _WIN32
                                | std::ios::binary
#endif
          );
          unsigned char* file_buffer = new unsigned char[len + 1];
          ifs.read(reinterpret_cast<char*>(file_buffer), len);
          unsigned char* encoded_buffer = new unsigned char[static_cast<int>(
            static_cast<double>(len) * 1.5 + 5.0)];

          size_t rlen =
            cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

          xml.StartElement("NamedMeasurement");
          xml.Attribute(measurementfile.match(1).c_str(),
                        measurementfile.match(2));
          xml.Attribute(measurementfile.match(3).c_str(),
                        measurementfile.match(4));
          xml.Attribute("encoding", "base64");
          std::ostringstream ostr;
          for (size_t cc = 0; cc < rlen; cc++) {
            ostr << encoded_buffer[cc];
            if (cc % 60 == 0 && cc) {
              ostr << std::endl;
            }
          }
          xml.Element("Value", ostr.str());
          xml.EndElement(); // NamedMeasurement
          delete[] file_buffer;
          delete[] encoded_buffer;
        }
      } else {
        int idx = 4;
        if (measurementfile.match(1) == "name") {
          idx = 2;
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", measurementfile.match(idx));
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(
          this->CTest, HANDLER_OUTPUT,
          "File \"" << filename << "\" not found." << std::endl, this->Quiet);
      }
      cxml.erase(measurementfile.start(),
                 measurementfile.end() - measurementfile.start());
    } else {
      done = true;
    }
  }
}